

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasAkzoNob_ASAi_dns.c
# Opt level: O0

int resB(sunrealtype tt,N_Vector yy,N_Vector yp,N_Vector yyB,N_Vector ypB,N_Vector rrB,
        void *user_dataB)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  long *in_RCX;
  long *in_RDX;
  long *in_RDI;
  long *in_R8;
  double *in_R9;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  sunrealtype tmp2;
  sunrealtype tmp1;
  sunrealtype k2overK;
  sunrealtype y1to3;
  sunrealtype y2tohalf;
  sunrealtype Ks;
  sunrealtype klA;
  sunrealtype K;
  sunrealtype k4;
  sunrealtype k3;
  sunrealtype k2;
  sunrealtype k1;
  sunrealtype ypB5;
  sunrealtype ypB4;
  sunrealtype ypB3;
  sunrealtype ypB2;
  sunrealtype ypB1;
  sunrealtype yB6;
  sunrealtype yB5;
  sunrealtype yB4;
  sunrealtype yB3;
  sunrealtype yB2;
  sunrealtype yB1;
  sunrealtype y6;
  sunrealtype y5;
  sunrealtype y4;
  sunrealtype y3;
  sunrealtype y2;
  sunrealtype y1;
  UserData data;
  
  dVar25 = *in_R9;
  dVar28 = in_R9[1];
  dVar1 = in_R9[2];
  dVar2 = in_R9[3];
  dVar22 = in_R9[4];
  dVar3 = in_R9[5];
  dVar4 = in_R9[6];
  dVar5 = **(double **)(*in_RDI + 0x10);
  dVar26 = *(double *)(*(long *)(*in_RDI + 0x10) + 8);
  dVar6 = *(double *)(*(long *)(*in_RDI + 0x10) + 0x10);
  dVar27 = *(double *)(*(long *)(*in_RDI + 0x10) + 0x18);
  dVar7 = *(double *)(*(long *)(*in_RDI + 0x10) + 0x20);
  dVar8 = *(double *)(*(long *)(*in_RDI + 0x10) + 0x28);
  dVar9 = **(double **)(*in_RDX + 0x10);
  dVar10 = *(double *)(*(long *)(*in_RDX + 0x10) + 8);
  dVar11 = *(double *)(*(long *)(*in_RDX + 0x10) + 0x10);
  dVar12 = *(double *)(*(long *)(*in_RDX + 0x10) + 0x18);
  dVar13 = *(double *)(*(long *)(*in_RDX + 0x10) + 0x20);
  dVar14 = *(double *)(*(long *)(*in_RDX + 0x10) + 0x28);
  dVar15 = **(double **)(*in_RCX + 0x10);
  dVar16 = *(double *)(*(long *)(*in_RCX + 0x10) + 8);
  dVar17 = *(double *)(*(long *)(*in_RCX + 0x10) + 0x10);
  dVar18 = *(double *)(*(long *)(*in_RCX + 0x10) + 0x18);
  dVar19 = *(double *)(*(long *)(*in_RCX + 0x10) + 0x20);
  dVar20 = sqrt(dVar26);
  dVar21 = dVar5 * dVar5 * dVar5;
  dVar22 = dVar28 / dVar22;
  dVar23 = dVar25 * dVar21 * dVar20;
  dVar24 = dVar1 * dVar27 * dVar27;
  **(double **)(*in_R8 + 0x10) =
       dVar4 * dVar27 * dVar14 +
       -(dVar24 * 2.0) * dVar12 +
       dVar22 * dVar7 * (dVar12 - dVar13) +
       (dVar23 * 4.0 + dVar22 * dVar7) * dVar11 +
       -(dVar23 + dVar23 + dVar24) * dVar10 +
       -(dVar23 * 8.0 + dVar22 * dVar7 + dVar24) * dVar9 + dVar15 + 1.0;
  dVar25 = dVar25 * dVar5 * dVar21 * (dVar20 / dVar26);
  dVar26 = dVar2 * dVar8 * dVar8 * (dVar20 / dVar26);
  *(double *)(*(long *)(*in_R8 + 0x10) + 8) =
       dVar26 * 0.5 * dVar13 +
       dVar25 * 0.5 * dVar11 +
       -(dVar25 * 0.25 + dVar26 * 0.25 + dVar3) * dVar10 + -dVar25 * dVar9 + dVar16;
  *(double *)(*(long *)(*in_R8 + 0x10) + 0x10) =
       dVar28 * dVar27 * (((dVar9 - dVar11) - dVar12) + dVar13) + dVar17;
  dVar27 = dVar1 * dVar5 * dVar27;
  dVar28 = dVar28 * dVar6;
  *(double *)(*(long *)(*in_R8 + 0x10) + 0x18) =
       dVar4 * dVar5 * dVar14 +
       dVar28 * dVar13 +
       -(dVar27 * 4.0 + dVar28) * dVar12 +
       -dVar28 * dVar11 + -(dVar27 * 2.0) * dVar10 + (dVar28 - (dVar27 + dVar27)) * dVar9 + dVar18;
  *(double *)(*(long *)(*in_R8 + 0x10) + 0x20) =
       -(dVar22 * dVar5) * (((dVar9 - dVar11) - dVar12) + dVar13) + dVar19;
  *(double *)(*(long *)(*in_R8 + 0x10) + 0x28) =
       dVar2 * dVar8 * dVar20 * (dVar13 + dVar13 + -dVar10) + -dVar14;
  return 0;
}

Assistant:

static int resB(sunrealtype tt, N_Vector yy, N_Vector yp, N_Vector yyB,
                N_Vector ypB, N_Vector rrB, void* user_dataB)
{
  UserData data;

  sunrealtype y1, y2, y3, y4, y5, y6;

  sunrealtype yB1, yB2, yB3, yB4, yB5, yB6;
  sunrealtype ypB1, ypB2, ypB3, ypB4, ypB5;

  sunrealtype k1, k2, k3, k4;
  sunrealtype K, klA, Ks;

  sunrealtype y2tohalf, y1to3, k2overK, tmp1, tmp2;

  data = (UserData)user_dataB;
  k1   = data->k1;
  k2   = data->k2;
  k3   = data->k3;
  k4   = data->k4;
  K    = data->K;
  klA  = data->klA;
  Ks   = data->Ks;

  y1 = Ith(yy, 1);
  y2 = Ith(yy, 2);
  y3 = Ith(yy, 3);
  y4 = Ith(yy, 4);
  y5 = Ith(yy, 5);
  y6 = Ith(yy, 6);

  yB1 = Ith(yyB, 1);
  yB2 = Ith(yyB, 2);
  yB3 = Ith(yyB, 3);
  yB4 = Ith(yyB, 4);
  yB5 = Ith(yyB, 5);
  yB6 = Ith(yyB, 6);

  ypB1 = Ith(ypB, 1);
  ypB2 = Ith(ypB, 2);
  ypB3 = Ith(ypB, 3);
  ypB4 = Ith(ypB, 4);
  ypB5 = Ith(ypB, 5);

  y2tohalf = sqrt(y2);
  y1to3    = y1 * y1 * y1;
  k2overK  = k2 / K;

  tmp1        = k1 * y1to3 * y2tohalf;
  tmp2        = k3 * y4 * y4;
  Ith(rrB, 1) = 1 + ypB1 - (EIGHT * tmp1 + k2overK * y5 + tmp2) * yB1 -
                (TWO * tmp1 + tmp2) * yB2 + (FOUR * tmp1 + k2overK * y5) * yB3 +
                k2overK * y5 * (yB4 - yB5) - TWO * tmp2 * yB4 + Ks * y4 * yB6;

  tmp1        = k1 * y1 * y1to3 * (y2tohalf / y2);
  tmp2        = k4 * y6 * y6 * (y2tohalf / y2);
  Ith(rrB, 2) = ypB2 - tmp1 * yB1 -
                (QUARTER * tmp1 + QUARTER * tmp2 + klA) * yB2 +
                HALF * tmp1 * yB3 + HALF * tmp2 * yB5;

  Ith(rrB, 3) = ypB3 + k2 * y4 * (yB1 - yB3 - yB4 + yB5);

  tmp1 = k3 * y1 * y4;
  tmp2 = k2 * y3;
  Ith(rrB, 4) = ypB4 + (tmp2 - TWO * tmp1) * yB1 - TWO * tmp1 * yB2 - tmp2 * yB3 -
                (tmp2 + FOUR * tmp1) * yB4 + tmp2 * yB5 + Ks * y1 * yB6;

  Ith(rrB, 5) = ypB5 - k2overK * y1 * (yB1 - yB3 - yB4 + yB5);

  Ith(rrB, 6) = k4 * y6 * y2tohalf * (2 * yB5 - yB2) - yB6;

  return 0;
}